

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O2

void __thiscall
dap::BasicTypeInfo<dap::ProgressUpdateEvent>::destruct
          (BasicTypeInfo<dap::ProgressUpdateEvent> *this,void *ptr)

{
  ProgressUpdateEvent::~ProgressUpdateEvent((ProgressUpdateEvent *)ptr);
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }